

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void CloneEmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,
                   FuncInfo *funcInfo)

{
  Scope *this;
  code *pcVar1;
  bool bVar2;
  OpCode op_00;
  uint C1;
  Scope *pSVar3;
  undefined4 *puVar4;
  ByteCodeWriter *this_00;
  OpCode op;
  Scope *scope;
  byte local_21;
  FuncInfo *pFStack_20;
  bool isConst;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeBlock *pnodeBlock_local;
  
  pFStack_20 = funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeBlock;
  bVar2 = BlockHasOwnScope(pnodeBlock,byteCodeGenerator);
  if (bVar2) {
    local_21 = 0;
    Scope::ForEachSymbolUntil<CloneEmitBlock(ParseNodeBlock*,ByteCodeGenerator*,FuncInfo*)::__0>
              ((Scope *)(byteCodeGenerator_local->m_writer).m_labelOffsets,
               (anon_class_8_1_fdea1739)&local_21);
    if ((local_21 & 1) == 0) {
      this = (Scope *)(byteCodeGenerator_local->m_writer).m_labelOffsets;
      pSVar3 = ByteCodeGenerator::GetCurrentScope((ByteCodeGenerator *)funcInfo_local);
      if (this != pSVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x38e,"(scope == byteCodeGenerator->GetCurrentScope())",
                           "scope == byteCodeGenerator->GetCurrentScope()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = Scope::GetMustInstantiate(this);
      if (bVar2) {
        bVar2 = Scope::GetIsObject(this);
        op_00 = CloneInnerScopeSlots;
        if (bVar2) {
          op_00 = CloneBlockScope;
        }
        this_00 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        C1 = Scope::GetInnerScopeIndex(this);
        Js::ByteCodeWriter::Unsigned1(this_00,op_00,C1);
      }
    }
  }
  return;
}

Assistant:

void CloneEmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    if (BlockHasOwnScope(pnodeBlock, byteCodeGenerator))
    {
        // Only let variables have observable behavior when there are per iteration
        // bindings.  const variables do not since they are immutable.  Therefore,
        // (and the spec agrees), only create new scope clones if the loop variable
        // is a let declaration.
        bool isConst = false;
        pnodeBlock->scope->ForEachSymbolUntil([&isConst](Symbol * const sym) {
            // Exploit the fact that a for loop sxBlock can only have let and const
            // declarations, and can only have one or the other, regardless of how
            // many syms there might be.  Thus only check the first sym.
            isConst = sym->GetDecl()->nop == knopConstDecl;
            return true;
        });

        if (!isConst)
        {
            Scope *scope = pnodeBlock->scope;
            Assert(scope == byteCodeGenerator->GetCurrentScope());

            if (scope->GetMustInstantiate())
            {
                Js::OpCode op = scope->GetIsObject() ? Js::OpCode::CloneBlockScope : Js::OpCode::CloneInnerScopeSlots;

                byteCodeGenerator->Writer()->Unsigned1(op, scope->GetInnerScopeIndex());
            }
        }
    }
}